

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O2

void bench_verify(void *arg,int iters)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uStack_d0;
  secp256k1_pubkey pubkey;
  secp256k1_ecdsa_signature sig;
  
  iVar6 = 0;
  if (iters < 1) {
    iters = 0;
  }
  while( true ) {
    if (iters == iVar6) {
      return;
    }
    pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x47);
    *pbVar1 = *pbVar1 ^ (byte)iVar6;
    bVar2 = (byte)((uint)iVar6 >> 8);
    pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x46);
    *pbVar1 = *pbVar1 ^ bVar2;
    bVar3 = (byte)((uint)iVar6 >> 0x10);
    pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x45);
    *pbVar1 = *pbVar1 ^ bVar3;
    iVar4 = secp256k1_ec_pubkey_parse
                      (*arg,&pubkey,(long)arg + 0x98,*(undefined8 *)((long)arg + 0xc0));
    if (iVar4 != 1) break;
    iVar4 = secp256k1_ecdsa_signature_parse_der
                      (*arg,&sig,(long)arg + 0x48,*(undefined8 *)((long)arg + 0x90));
    if (iVar4 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_signature_parse_der(data->ctx, &sig, data->sig, data->siglen) == 1"
      ;
      uStack_d0 = 0x5f;
      goto LAB_00103631;
    }
    uVar5 = secp256k1_ecdsa_verify(*arg,&sig,(long)arg + 8,&pubkey);
    if (uVar5 != (iVar6 == 0)) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_verify(data->ctx, &sig, data->msg, &pubkey) == (i == 0)"
      ;
      uStack_d0 = 0x60;
      goto LAB_00103631;
    }
    pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x47);
    *pbVar1 = *pbVar1 ^ (byte)iVar6;
    pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x46);
    *pbVar1 = *pbVar1 ^ bVar2;
    pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x45);
    *pbVar1 = *pbVar1 ^ bVar3;
    iVar6 = iVar6 + 1;
  }
  pcVar7 = 
  "test condition failed: secp256k1_ec_pubkey_parse(data->ctx, &pubkey, data->pubkey, data->pubkeylen) == 1"
  ;
  uStack_d0 = 0x5e;
LAB_00103631:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench.c",
          uStack_d0,pcVar7);
  abort();
}

Assistant:

static void bench_verify(void* arg, int iters) {
    int i;
    bench_data* data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_pubkey pubkey;
        secp256k1_ecdsa_signature sig;
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
        CHECK(secp256k1_ec_pubkey_parse(data->ctx, &pubkey, data->pubkey, data->pubkeylen) == 1);
        CHECK(secp256k1_ecdsa_signature_parse_der(data->ctx, &sig, data->sig, data->siglen) == 1);
        CHECK(secp256k1_ecdsa_verify(data->ctx, &sig, data->msg, &pubkey) == (i == 0));
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
    }
}